

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm_manager.cc
# Opt level: O3

RC __thiscall SM_Manager::CloseDb(SM_Manager *this)

{
  RC RVar1;
  
  RVar1 = RM_Manager::CloseFile(this->rmm,&this->relcatFH);
  if (RVar1 != 0) {
    return RVar1;
  }
  RVar1 = RM_Manager::CloseFile(this->rmm,&this->attrcatFH);
  return RVar1;
}

Assistant:

RC SM_Manager::CloseDb()
{
  
  RC rc = 0;
  if((rc = rmm.CloseFile(relcatFH) )){
    return (rc);
  }
  if((rc = rmm.CloseFile(attrcatFH))){
    return (rc);
  } 
  
  return (0);
}